

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O3

matches * atomimm_a(iasctx *ctx,void *v,int spos)

{
  litem *plVar1;
  easm_expr *peVar2;
  int iVar3;
  matches *__ptr;
  match *res;
  
  if ((ctx->atomsnum != spos) && (plVar1 = ctx->atoms[spos], plVar1->type == LITEM_EXPR)) {
    __ptr = (matches *)calloc(0x10,1);
    __ptr->mmax = 0x10;
    res = (match *)malloc(0xb80);
    __ptr->m = res;
    __ptr->mnum = 1;
    *(undefined8 *)res = 0;
    res->a[0] = 0;
    res->a[1] = 0;
    res->m[0] = 0;
    res->m[1] = 0;
    res->lpos = spos + 1;
    memset(&res->field_0x2c,0,0x8c);
    peVar2 = plVar1->expr;
    if ((peVar2->type == EASM_EXPR_NUM) &&
       (iVar3 = setbf(res,(bitfield *)v,peVar2->num), iVar3 != 0)) {
      return __ptr;
    }
    free(res);
    free(__ptr);
  }
  return (matches *)0x0;
}

Assistant:

struct matches *atomimm_a APROTO {
	const struct bitfield *bf = v;
	if (spos == ctx->atomsnum || ctx->atoms[spos]->type != LITEM_EXPR)
		return 0;
	struct matches *res = alwaysmatches(spos+1);
	struct easm_expr *expr = ctx->atoms[spos]->expr;
	if (expr->type == EASM_EXPR_NUM && setbf(res->m, bf, expr->num))
		return res;
	else {
		free(res->m);
		free(res);
		return 0;
	}
}